

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O1

bool oldDecrunch(RGBE *scanline,int len,FILE *file)

{
  RGBE auVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  bool local_3d;
  int local_3c;
  
  local_3d = len < 1;
  if (0 < len) {
    iVar5 = fgetc((FILE *)file);
    (*scanline)[0] = (uchar)iVar5;
    iVar5 = fgetc((FILE *)file);
    (*scanline)[1] = (uchar)iVar5;
    iVar5 = fgetc((FILE *)file);
    (*scanline)[2] = (uchar)iVar5;
    iVar5 = fgetc((FILE *)file);
    (*scanline)[3] = (uchar)iVar5;
    iVar5 = feof((FILE *)file);
    if (iVar5 == 0) {
      puVar2 = *scanline;
      puVar3 = *scanline;
      puVar4 = *scanline;
      uVar7 = 0;
      local_3c = len;
      do {
        if ((((*scanline)[0] == '\x01') && (puVar2[1] == '\x01')) && (puVar3[2] == '\x01')) {
          iVar5 = (uint)puVar4[3] << (uVar7 & 0x1f);
          if (0 < (int)((uint)puVar4[3] << (uVar7 & 0x1f))) {
            auVar1 = scanline[-1];
            iVar6 = iVar5 + 1;
            do {
              *scanline = auVar1;
              scanline = scanline + 1;
              iVar6 = iVar6 + -1;
            } while (1 < iVar6);
            local_3c = local_3c - iVar5;
          }
          uVar7 = uVar7 + 8;
        }
        else {
          scanline = scanline + 1;
          local_3c = local_3c + -1;
          uVar7 = 0;
        }
        local_3d = local_3c < 1;
        if (local_3c < 1) {
          return local_3d;
        }
        iVar5 = fgetc((FILE *)file);
        (*scanline)[0] = (uchar)iVar5;
        iVar5 = fgetc((FILE *)file);
        puVar2 = *scanline;
        (*scanline)[1] = (uchar)iVar5;
        iVar5 = fgetc((FILE *)file);
        puVar3 = *scanline;
        (*scanline)[2] = (uchar)iVar5;
        iVar5 = fgetc((FILE *)file);
        puVar4 = *scanline;
        (*scanline)[3] = (uchar)iVar5;
        iVar5 = feof((FILE *)file);
      } while (iVar5 == 0);
    }
  }
  return local_3d;
}

Assistant:

bool oldDecrunch(RGBE *scanline, int len, FILE *file)
{
	int i;
	int rshift = 0;
	
	while (len > 0) {
		scanline[0][R] = fgetc(file);
		scanline[0][G] = fgetc(file);
		scanline[0][B] = fgetc(file);
		scanline[0][E] = fgetc(file);
		if (feof(file))
			return false;

		if (scanline[0][R] == 1 &&
			scanline[0][G] == 1 &&
			scanline[0][B] == 1) {
			for (i = scanline[0][E] << rshift; i > 0; i--) {
				memcpy(&scanline[0][0], &scanline[-1][0], 4);
				scanline++;
				len--;
			}
			rshift += 8;
		}
		else {
			scanline++;
			len--;
			rshift = 0;
		}
	}
	return true;
}